

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::ParquetWriteSelect
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,CopyToSelectInput *input)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *pvVar1;
  char cVar2;
  bool bVar3;
  CopyToType CVar4;
  pointer pEVar5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *pvVar6;
  LogicalType *pLVar7;
  idx_t iVar8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *pvVar9;
  child_list_t<LogicalType> *__range3;
  bool bVar10;
  pointer this;
  LogicalType *pLVar11;
  _Alloc_hider _Var12;
  LogicalType wkb_blob_type;
  long *local_130;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_118;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_f8;
  LogicalType new_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d8;
  ClientContext *local_d0;
  LogicalType value;
  optional_idx local_b0 [3];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_98;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_80;
  CopyToSelectInput *local_78;
  pointer local_70;
  LogicalType local_68 [24];
  string local_50 [32];
  
  local_d0 = input->context;
  local_98.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (input->select_list).
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (input->select_list).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar10 = false;
  local_80 = &__return_storage_ptr__->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ;
  local_78 = input;
  do {
    pvVar1 = local_80;
    if (this == local_70) {
      pvVar9 = local_80;
      if (bVar10) {
        (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           *)&(local_80->
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              )._M_impl)->_M_impl).super__Vector_impl_data._M_start =
             local_98.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           *)&(local_80->
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              )._M_impl)->_M_impl).super__Vector_impl_data._M_finish =
             local_98.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           *)&(local_80->
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              )._M_impl)->_M_impl).super__Vector_impl_data._M_end_of_storage =
             local_98.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar9 = &local_98;
      }
      (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)&(pvVar9->
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            )._M_impl)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)&(pvVar9->
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            )._M_impl)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)&(pvVar9->
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            )._M_impl)->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_98);
      return (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)pvVar1;
    }
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->(this);
    pLVar11 = (LogicalType *)(pEVar5 + 0x38);
    CVar4 = local_78->copy_to_type;
    if (CVar4 == COPY_TO_FILE) {
      if (*pLVar11 != (LogicalType)0x1a) goto LAB_002cdff0;
      cVar2 = duckdb::LogicalType::HasAlias();
      if (cVar2 == '\0') {
LAB_002cdf5d:
        CVar4 = local_78->copy_to_type;
        goto LAB_002cdf68;
      }
      duckdb::LogicalType::GetAlias_abi_cxx11_();
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &wkb_blob_type,"GEOMETRY");
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&wkb_blob_type);
        goto LAB_002cdf5d;
      }
      bVar3 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled(local_d0);
      std::__cxx11::string::~string((string *)&wkb_blob_type);
      if (!bVar3) goto LAB_002cdf5d;
      duckdb::LogicalType::LogicalType(&wkb_blob_type,BLOB);
      std::__cxx11::string::string(local_50,"WKB_BLOB",(allocator *)&value);
      duckdb::LogicalType::SetAlias(&wkb_blob_type,local_50);
      std::__cxx11::string::~string(local_50);
      local_d8._M_head_impl =
           (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      duckdb::BoundCastExpression::AddCastToType(&value,local_d0,&local_d8,&wkb_blob_type,0);
      if (local_d8._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
      local_d8._M_head_impl = (Expression *)0x0;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&value);
      std::__cxx11::string::_M_assign((string *)(pEVar5 + 0x10));
      std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_98,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &value);
      pLVar11 = &wkb_blob_type;
      if (_value != (long *)0x0) {
        (**(code **)(*_value + 8))();
        pLVar11 = &wkb_blob_type;
      }
      goto LAB_002ce5a4;
    }
LAB_002cdf68:
    if ((CVar4 != EXPORT_DATABASE) ||
       (bVar3 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar11,IsTypeLossy),
       !bVar3)) {
LAB_002cdff0:
      bVar3 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar11,IsTypeNotSupported)
      ;
      if (!bVar3) {
        std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_98,this);
        goto LAB_002ce5ac;
      }
      switch(*pLVar11) {
      case (LogicalType)0x64:
        pvVar6 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)duckdb::StructType::GetChildTypes_abi_cxx11_(pLVar11);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&wkb_blob_type,pvVar6);
        for (_Var12._M_p = _wkb_blob_type; (long *)_Var12._M_p != local_130;
            _Var12._M_p = _Var12._M_p + 0x38) {
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&value,(anon_class_1_0_00000001 *)((long)_Var12._M_p + 0x20));
          LogicalType::operator=((LogicalType *)((long)_Var12._M_p + 0x20),&value);
          duckdb::LogicalType::~LogicalType(&value);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector(&local_118,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&wkb_blob_type);
        duckdb::LogicalType::STRUCT(&value,&local_118);
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,&value);
        break;
      case (LogicalType)0x65:
        pLVar11 = (LogicalType *)duckdb::ListType::GetChildType(pLVar11);
        duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar11);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  ((LogicalType *)&local_118,(anon_class_1_0_00000001 *)&wkb_blob_type);
        duckdb::LogicalType::LIST(&value);
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,&value);
        goto LAB_002ce213;
      case (LogicalType)0x66:
        pLVar7 = (LogicalType *)duckdb::MapType::KeyType(pLVar11);
        duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar7);
        pLVar11 = (LogicalType *)duckdb::MapType::ValueType(pLVar11);
        duckdb::LogicalType::LogicalType(&value,pLVar11);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  ((LogicalType *)local_b0,(anon_class_1_0_00000001 *)&wkb_blob_type);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  (local_68,(anon_class_1_0_00000001 *)&value);
        duckdb::LogicalType::MAP((LogicalType *)&local_118,local_b0,local_68);
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,(LogicalType *)&local_118);
        duckdb::LogicalType::~LogicalType((LogicalType *)&local_118);
        duckdb::LogicalType::~LogicalType(local_68);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
        pLVar11 = &value;
        goto LAB_002ce220;
      default:
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,pLVar11);
        goto LAB_002ce2a1;
      case (LogicalType)0x6b:
        duckdb::UnionType::CopyMemberTypes_abi_cxx11_(&wkb_blob_type);
        for (_Var12._M_p = _wkb_blob_type; (long *)_Var12._M_p != local_130;
            _Var12._M_p = _Var12._M_p + 0x38) {
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&value,(anon_class_1_0_00000001 *)((long)_Var12._M_p + 0x20));
          LogicalType::operator=((LogicalType *)((long)_Var12._M_p + 0x20),&value);
          duckdb::LogicalType::~LogicalType(&value);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector(&local_118,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&wkb_blob_type);
        duckdb::LogicalType::UNION(&value,&local_118);
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,&value);
        break;
      case (LogicalType)0x6c:
        pLVar7 = (LogicalType *)duckdb::ArrayType::GetChildType(pLVar11);
        duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar7);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  ((LogicalType *)&local_118,(anon_class_1_0_00000001 *)&wkb_blob_type);
        iVar8 = duckdb::ArrayType::GetSize(pLVar11);
        optional_idx::optional_idx(local_b0,iVar8);
        duckdb::LogicalType::ARRAY(&value,(optional_idx)&local_118);
        ParquetWriteSelect::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&new_type,&value);
LAB_002ce213:
        duckdb::LogicalType::~LogicalType(&value);
        pLVar11 = (LogicalType *)&local_118;
LAB_002ce220:
        duckdb::LogicalType::~LogicalType(pLVar11);
        duckdb::LogicalType::~LogicalType(&wkb_blob_type);
        goto LAB_002ce2a1;
      }
      duckdb::LogicalType::~LogicalType(&value);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector(&local_118);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&wkb_blob_type);
LAB_002ce2a1:
      local_100._M_head_impl =
           (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      duckdb::BoundCastExpression::AddCastToType(&wkb_blob_type,local_d0,&local_100,&new_type,0);
      if (local_100._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
      local_100._M_head_impl = (Expression *)0x0;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&wkb_blob_type);
      std::__cxx11::string::_M_assign((string *)(pEVar5 + 0x10));
      std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_98,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &wkb_blob_type);
      goto LAB_002ce590;
    }
    switch(*pLVar11) {
    case (LogicalType)0x64:
      pvVar6 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)duckdb::StructType::GetChildTypes_abi_cxx11_(pLVar11);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&wkb_blob_type,pvVar6);
      for (_Var12._M_p = _wkb_blob_type; (long *)_Var12._M_p != local_130;
          _Var12._M_p = _Var12._M_p + 0x38) {
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&value,(anon_class_1_0_00000001 *)((long)_Var12._M_p + 0x20));
        LogicalType::operator=((LogicalType *)((long)_Var12._M_p + 0x20),&value);
        duckdb::LogicalType::~LogicalType(&value);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector(&local_118,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&wkb_blob_type);
      duckdb::LogicalType::STRUCT(&value,&local_118);
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,&value);
      break;
    case (LogicalType)0x65:
      pLVar11 = (LogicalType *)duckdb::ListType::GetChildType(pLVar11);
      duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar11);
      TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                ((LogicalType *)&local_118,(anon_class_1_0_00000001 *)&wkb_blob_type);
      duckdb::LogicalType::LIST(&value);
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,&value);
      goto LAB_002ce49d;
    case (LogicalType)0x66:
      pLVar7 = (LogicalType *)duckdb::MapType::KeyType(pLVar11);
      duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar7);
      pLVar11 = (LogicalType *)duckdb::MapType::ValueType(pLVar11);
      duckdb::LogicalType::LogicalType(&value,pLVar11);
      TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                ((LogicalType *)local_b0,(anon_class_1_0_00000001 *)&wkb_blob_type);
      TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                (local_68,(anon_class_1_0_00000001 *)&value);
      duckdb::LogicalType::MAP((LogicalType *)&local_118,local_b0,local_68);
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,(LogicalType *)&local_118);
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_118);
      duckdb::LogicalType::~LogicalType(local_68);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
      pLVar11 = &value;
      goto LAB_002ce4aa;
    default:
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,pLVar11);
      goto LAB_002ce52b;
    case (LogicalType)0x6b:
      duckdb::UnionType::CopyMemberTypes_abi_cxx11_(&wkb_blob_type);
      for (_Var12._M_p = _wkb_blob_type; (long *)_Var12._M_p != local_130;
          _Var12._M_p = _Var12._M_p + 0x38) {
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&value,(anon_class_1_0_00000001 *)((long)_Var12._M_p + 0x20));
        LogicalType::operator=((LogicalType *)((long)_Var12._M_p + 0x20),&value);
        duckdb::LogicalType::~LogicalType(&value);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector(&local_118,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&wkb_blob_type);
      duckdb::LogicalType::UNION(&value,&local_118);
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,&value);
      break;
    case (LogicalType)0x6c:
      pLVar7 = (LogicalType *)duckdb::ArrayType::GetChildType(pLVar11);
      duckdb::LogicalType::LogicalType(&wkb_blob_type,pLVar7);
      TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                ((LogicalType *)&local_118,(anon_class_1_0_00000001 *)&wkb_blob_type);
      iVar8 = duckdb::ArrayType::GetSize(pLVar11);
      optional_idx::optional_idx(local_b0,iVar8);
      duckdb::LogicalType::ARRAY(&value,(optional_idx)&local_118);
      ParquetWriteSelect::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&new_type,&value);
LAB_002ce49d:
      duckdb::LogicalType::~LogicalType(&value);
      pLVar11 = (LogicalType *)&local_118;
LAB_002ce4aa:
      duckdb::LogicalType::~LogicalType(pLVar11);
      duckdb::LogicalType::~LogicalType(&wkb_blob_type);
      goto LAB_002ce52b;
    }
    duckdb::LogicalType::~LogicalType(&value);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(&local_118);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&wkb_blob_type);
LAB_002ce52b:
    local_f8._M_head_impl =
         (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::BoundCastExpression::AddCastToType(&wkb_blob_type,local_d0,&local_f8,&new_type,0);
    if (local_f8._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
    local_f8._M_head_impl = (Expression *)0x0;
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&wkb_blob_type);
    std::__cxx11::string::_M_assign((string *)(pEVar5 + 0x10));
    std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_98,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &wkb_blob_type);
LAB_002ce590:
    if ((long *)_wkb_blob_type != (long *)0x0) {
      (**(code **)(*(long *)_wkb_blob_type + 8))();
    }
    pLVar11 = &new_type;
LAB_002ce5a4:
    duckdb::LogicalType::~LogicalType(pLVar11);
    bVar10 = true;
LAB_002ce5ac:
    this = this + 1;
  } while( true );
}

Assistant:

static vector<unique_ptr<Expression>> ParquetWriteSelect(CopyToSelectInput &input) {

	auto &context = input.context;

	vector<unique_ptr<Expression>> result;

	bool any_change = false;

	for (auto &expr : input.select_list) {

		const auto &type = expr->return_type;
		const auto &name = expr->GetAlias();

		// Spatial types need to be encoded into WKB when writing GeoParquet.
		// But dont perform this conversion if this is a EXPORT DATABASE statement
		if (input.copy_to_type == CopyToType::COPY_TO_FILE && type.id() == LogicalTypeId::BLOB && type.HasAlias() &&
		    type.GetAlias() == "GEOMETRY" && GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {

			LogicalType wkb_blob_type(LogicalTypeId::BLOB);
			wkb_blob_type.SetAlias("WKB_BLOB");

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), wkb_blob_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// If this is an EXPORT DATABASE statement, we dont want to write "lossy" types, instead cast them to VARCHAR
		else if (input.copy_to_type == CopyToType::EXPORT_DATABASE && TypeVisitor::Contains(type, IsTypeLossy)) {
			// Replace all lossy types with VARCHAR
			auto new_type = TypeVisitor::VisitReplace(
			    type, [](const LogicalType &ty) -> LogicalType { return IsTypeLossy(ty) ? LogicalType::VARCHAR : ty; });

			// Cast the column to the new type
			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Else look if there is any unsupported type
		else if (TypeVisitor::Contains(type, IsTypeNotSupported)) {
			// If there is at least one unsupported type, replace all unsupported types with varchar
			// and perform a CAST
			auto new_type = TypeVisitor::VisitReplace(type, [](const LogicalType &ty) -> LogicalType {
				return IsTypeNotSupported(ty) ? LogicalType::VARCHAR : ty;
			});

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Otherwise, just reference the input column
		else {
			result.push_back(std::move(expr));
		}
	}

	// If any change was made, return the new expressions
	// otherwise, return an empty vector to indicate no change and avoid pushing another projection on to the plan
	if (any_change) {
		return result;
	}
	return {};
}